

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

int Abc_AigNodeIsAcyclic(Abc_Obj_t *pNode,Abc_Obj_t *pRoot)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pChild11;
  Abc_Obj_t *pChild10;
  Abc_Obj_t *pChild01;
  Abc_Obj_t *pChild00;
  Abc_Obj_t *pFanin1;
  Abc_Obj_t *pFanin0;
  Abc_Obj_t *pRoot_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_AigNodeIsAnd(pNode);
  if (iVar1 == 0) {
    pNode_local._4_4_ = 1;
  }
  else {
    pAVar2 = Abc_ObjFanin0(pNode);
    pAVar3 = Abc_ObjFanin1(pNode);
    if ((pRoot == pAVar2) || (pRoot == pAVar3)) {
      pNode_local._4_4_ = 0;
    }
    else {
      iVar1 = Abc_ObjIsCi(pAVar2);
      if (iVar1 == 0) {
        pAVar4 = Abc_ObjFanin0(pAVar2);
        pAVar2 = Abc_ObjFanin1(pAVar2);
        if ((pRoot == pAVar4) || (pRoot == pAVar2)) {
          return 0;
        }
      }
      iVar1 = Abc_ObjIsCi(pAVar3);
      if (iVar1 == 0) {
        pAVar2 = Abc_ObjFanin0(pAVar3);
        pAVar3 = Abc_ObjFanin1(pAVar3);
        if ((pRoot == pAVar2) || (pRoot == pAVar3)) {
          return 0;
        }
      }
      pNode_local._4_4_ = 1;
    }
  }
  return pNode_local._4_4_;
}

Assistant:

int Abc_AigNodeIsAcyclic( Abc_Obj_t * pNode, Abc_Obj_t * pRoot )
{
    Abc_Obj_t * pFanin0, * pFanin1;
    Abc_Obj_t * pChild00, * pChild01;
    Abc_Obj_t * pChild10, * pChild11;
    if ( !Abc_AigNodeIsAnd(pNode) )
        return 1;
    pFanin0 = Abc_ObjFanin0(pNode);
    pFanin1 = Abc_ObjFanin1(pNode);
    if ( pRoot == pFanin0 || pRoot == pFanin1 )
        return 0;
    if ( Abc_ObjIsCi(pFanin0) )
    {
        pChild00 = NULL;
        pChild01 = NULL;
    }
    else
    {
        pChild00 = Abc_ObjFanin0(pFanin0);
        pChild01 = Abc_ObjFanin1(pFanin0);
        if ( pRoot == pChild00 || pRoot == pChild01 )
            return 0;
    }
    if ( Abc_ObjIsCi(pFanin1) )
    {
        pChild10 = NULL;
        pChild11 = NULL;
    }
    else
    {
        pChild10 = Abc_ObjFanin0(pFanin1);
        pChild11 = Abc_ObjFanin1(pFanin1);
        if ( pRoot == pChild10 || pRoot == pChild11 )
            return 0;
    }
    return 1;
}